

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void set_reader_options(bsdtar *bsdtar,archive *a)

{
  wchar_t wVar1;
  char *pcVar2;
  size_t sVar3;
  char *__dest;
  uint *puVar4;
  archive *in_RSI;
  char *p;
  int r;
  char *reader_options;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pcVar2 = getenv("TAR_READER_OPTIONS");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    __dest = (char *)malloc(sVar3 + 0x1f);
    if (__dest == (char *)0x0) {
      puVar4 = (uint *)__errno_location();
      lafe_errc(1,(int)(ulong)*puVar4,"Out of memory");
    }
    strncpy(__dest,"__ignore_wrong_module_name__,",0x1d);
    strcpy(__dest + 0x1d,pcVar2);
    wVar1 = archive_read_set_options
                      ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       __dest);
    free(__dest);
    if (wVar1 < L'\xffffffec') {
      pcVar2 = archive_error_string(in_RSI);
      lafe_errc(1,0,"%s",pcVar2);
    }
    archive_clear_error(in_RSI);
  }
  return;
}

Assistant:

static void
set_reader_options(struct bsdtar *bsdtar, struct archive *a)
{
	const char *reader_options;
	int r;

	(void)bsdtar; /* UNUSED */

	reader_options = getenv(ENV_READER_OPTIONS);
	if (reader_options != NULL) {
		char *p;
		/* Set default write options. */
		p = malloc(sizeof(IGNORE_WRONG_MODULE_NAME)
		    + strlen(reader_options) + 1);
		if (p == NULL)
			lafe_errc(1, errno, "Out of memory");
		/* Prepend magic code to ignore options for
		 * a format or filters which are not added to
		 * the archive write object. */
		strncpy(p, IGNORE_WRONG_MODULE_NAME,
		    sizeof(IGNORE_WRONG_MODULE_NAME) -1);
		strcpy(p + sizeof(IGNORE_WRONG_MODULE_NAME) -1, reader_options);
		r = archive_read_set_options(a, p);
		free(p);
		if (r < ARCHIVE_WARN)
			lafe_errc(1, 0, "%s", archive_error_string(a));
		else
			archive_clear_error(a);
	}
}